

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O0

size_t sentencepiece::SentencePieceTrainer::Train
                 (string_view args,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *sentences,string *serialized_model_proto)

{
  undefined1 local_48 [8];
  VectorSentenceIterator iter;
  string *serialized_model_proto_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sentences_local;
  string_view args_local;
  
  anon_unknown_5::VectorSentenceIterator::VectorSentenceIterator
            ((VectorSentenceIterator *)local_48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)serialized_model_proto);
  Train(args,(SentenceIterator *)sentences,(string *)local_48);
  anon_unknown_5::VectorSentenceIterator::~VectorSentenceIterator
            ((VectorSentenceIterator *)local_48);
  return args._M_len;
}

Assistant:

util::Status SentencePieceTrainer::Train(
    absl::string_view args, const std::vector<std::string> &sentences,
    std::string *serialized_model_proto) {
  VectorSentenceIterator iter(sentences);
  return Train(args, &iter, serialized_model_proto);
}